

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaTargetGenerator::WriteTargetDependInfo(cmNinjaTargetGenerator *this,string *lang)

{
  cmMakefile *this_00;
  cmGeneratorTarget *pcVar1;
  cmLocalNinjaGenerator *this_01;
  int iVar2;
  Value *pVVar3;
  long *plVar4;
  char *pcVar5;
  char *__s;
  string *config;
  cmGlobalNinjaGenerator *this_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  pointer pbVar7;
  string tdin;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  Value tdi;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linked;
  cmGeneratedFileStream tdif;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  string *local_440;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_438;
  Value local_420;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3f8;
  Value local_3e0;
  Value local_3b8;
  Value local_390;
  Value local_368;
  Value local_340;
  Value local_318;
  Value local_2f0;
  Value local_2c8;
  Value local_2a0;
  ValueHolder local_278;
  char *local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [35];
  
  Json::Value::Value(&local_420,objectValue);
  local_440 = lang;
  Json::Value::Value(&local_2a0,lang);
  pVVar3 = Json::Value::operator[](&local_420,"language");
  Json::Value::operator=(pVVar3,&local_2a0);
  Json::Value::~Value(&local_2a0);
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::operator+(&local_460,"CMAKE_",local_440);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_460);
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 == paVar6) {
    local_268[0]._0_8_ = paVar6->_M_allocated_capacity;
    local_268[0]._8_8_ = plVar4[3];
    local_278.string_ = (char *)local_268;
  }
  else {
    local_268[0]._0_8_ = paVar6->_M_allocated_capacity;
    local_278.string_ = ((char *)*plVar4).string_;
  }
  local_270 = (char *)plVar4[1];
  *plVar4 = (long)paVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  pcVar5 = cmMakefile::GetSafeDefinition(this_00,(string *)&local_278);
  Json::Value::Value(&local_2c8,pcVar5);
  pVVar3 = Json::Value::operator[](&local_420,"compiler-id");
  Json::Value::operator=(pVVar3,&local_2c8);
  Json::Value::~Value(&local_2c8);
  if (local_278 != local_268) {
    operator_delete(local_278.string_,local_268[0]._M_allocated_capacity + 1);
  }
  paVar6 = &local_460.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != paVar6) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  iVar2 = std::__cxx11::string::compare((char *)local_440);
  if (iVar2 == 0) {
    pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    pcVar5 = cmMakefile::GetHomeOutputDirectory((this->super_cmCommonTargetGenerator).Makefile);
    std::__cxx11::string::string((string *)&local_460,pcVar5,(allocator *)&local_438);
    cmGeneratorTarget::GetFortranModuleDirectory((string *)&local_278,pcVar1,&local_460);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != paVar6) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
    if (local_270 == (char *)0x0) {
      __s = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommonTargetGenerator).Makefile);
      pcVar5 = local_270;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&local_278,0,pcVar5,(ulong)__s);
    }
    Json::Value::Value(&local_2f0,(string *)&local_278);
    pVVar3 = Json::Value::operator[](&local_420,"module-dir");
    Json::Value::operator=(pVVar3,&local_2f0);
    Json::Value::~Value(&local_2f0);
    if (local_278 != local_268) {
      operator_delete(local_278.string_,local_268[0]._M_allocated_capacity + 1);
    }
  }
  pcVar5 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_318,pcVar5);
  pVVar3 = Json::Value::operator[](&local_420,"dir-cur-bld");
  Json::Value::operator=(pVVar3,&local_318);
  Json::Value::~Value(&local_318);
  pcVar5 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_340,pcVar5);
  pVVar3 = Json::Value::operator[](&local_420,"dir-cur-src");
  Json::Value::operator=(pVVar3,&local_340);
  Json::Value::~Value(&local_340);
  pcVar5 = cmMakefile::GetHomeOutputDirectory((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_368,pcVar5);
  pVVar3 = Json::Value::operator[](&local_420,"dir-top-bld");
  Json::Value::operator=(pVVar3,&local_368);
  Json::Value::~Value(&local_368);
  pcVar5 = cmMakefile::GetHomeDirectory((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_390,pcVar5);
  pVVar3 = Json::Value::operator[](&local_420,"dir-top-src");
  Json::Value::operator=(pVVar3,&local_390);
  Json::Value::~Value(&local_390);
  Json::Value::Value(&local_3b8,arrayValue);
  pVVar3 = Json::Value::operator[](&local_420,"include-dirs");
  pVVar3 = Json::Value::operator=(pVVar3,&local_3b8);
  Json::Value::~Value(&local_3b8);
  local_438.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_438.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_438.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  this_01 = this->LocalGenerator;
  config = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator);
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)this_01,&local_438,pcVar1,local_440,config,true);
  if (local_438.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_438.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar7 = local_438.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_02 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      cmGlobalNinjaGenerator::ConvertToNinjaPath(&local_460,this_02,pbVar7);
      Json::Value::Value((Value *)&local_278,&local_460);
      Json::Value::append(pVVar3,(Value *)&local_278);
      Json::Value::~Value((Value *)&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p != paVar6) {
        operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != local_438.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  Json::Value::Value(&local_3e0,arrayValue);
  pVVar3 = Json::Value::operator[](&local_420,"linked-target-dirs");
  pVVar3 = Json::Value::operator=(pVVar3,&local_3e0);
  Json::Value::~Value(&local_3e0);
  cmCommonTargetGenerator::GetLinkedTargetDirectories_abi_cxx11_
            (&local_3f8,&this->super_cmCommonTargetGenerator);
  if (local_3f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_3f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar7 = local_3f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      Json::Value::Value((Value *)&local_278,pbVar7);
      Json::Value::append(pVVar3,(Value *)&local_278);
      Json::Value::~Value((Value *)&local_278);
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != local_3f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  GetTargetDependInfoPath(&local_460,this,local_440);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)&local_278,local_460._M_dataplus._M_p,false,None);
  Json::operator<<((ostream *)&local_278,&local_420);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != paVar6) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_438);
  Json::Value::~Value(&local_420);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteTargetDependInfo(std::string const& lang)
{
  Json::Value tdi(Json::objectValue);
  tdi["language"] = lang;
  tdi["compiler-id"] =
    this->Makefile->GetSafeDefinition("CMAKE_" + lang + "_COMPILER_ID");

  if (lang == "Fortran") {
    std::string mod_dir = this->GeneratorTarget->GetFortranModuleDirectory(
      this->Makefile->GetHomeOutputDirectory());
    if (mod_dir.empty()) {
      mod_dir = this->Makefile->GetCurrentBinaryDirectory();
    }
    tdi["module-dir"] = mod_dir;
  }

  tdi["dir-cur-bld"] = this->Makefile->GetCurrentBinaryDirectory();
  tdi["dir-cur-src"] = this->Makefile->GetCurrentSourceDirectory();
  tdi["dir-top-bld"] = this->Makefile->GetHomeOutputDirectory();
  tdi["dir-top-src"] = this->Makefile->GetHomeDirectory();

  Json::Value& tdi_include_dirs = tdi["include-dirs"] = Json::arrayValue;
  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, this->GetConfigName());
  for (std::vector<std::string>::iterator i = includes.begin();
       i != includes.end(); ++i) {
    // Convert the include directories the same way we do for -I flags.
    // See upstream ninja issue 1251.
    tdi_include_dirs.append(this->ConvertToNinjaPath(*i));
  }

  Json::Value& tdi_linked_target_dirs = tdi["linked-target-dirs"] =
    Json::arrayValue;
  std::vector<std::string> linked = this->GetLinkedTargetDirectories();
  for (std::vector<std::string>::iterator i = linked.begin();
       i != linked.end(); ++i) {
    tdi_linked_target_dirs.append(*i);
  }

  std::string const tdin = this->GetTargetDependInfoPath(lang);
  cmGeneratedFileStream tdif(tdin.c_str());
  tdif << tdi;
}